

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

type_info * pybind11::detail::get_type_info(PyTypeObject *type)

{
  internals *piVar1;
  const_iterator cVar2;
  PyTypeObject *local_28;
  
  piVar1 = get_internals();
  do {
    local_28 = type;
    cVar2 = std::
            _Hashtable<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(piVar1->registered_types_py)._M_h,&local_28);
    if (cVar2.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur !=
        (__node_type *)0x0) {
      return *(type_info **)
              ((long)cVar2.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>.
                     _M_cur + 0x10);
    }
    type = type->tp_base;
  } while (type != (_typeobject *)0x0);
  return (type_info *)0x0;
}

Assistant:

PYBIND11_NOINLINE inline detail::type_info* get_type_info(PyTypeObject *type) {
    auto const &type_dict = get_internals().registered_types_py;
    do {
        auto it = type_dict.find(type);
        if (it != type_dict.end())
            return (detail::type_info *) it->second;
        type = type->tp_base;
        if (!type)
            return nullptr;
    } while (true);
}